

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

int lws_strexp_expand(lws_strexp_t *exp,char *in,size_t len,size_t *pused_in,size_t *pused_out)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  
  if (len == 0) {
    len = 0;
  }
  else {
    sVar5 = 0;
    do {
      switch(exp->state) {
      case '\0':
        if (in[sVar5] == '$') {
          exp->state = '\x01';
        }
        else {
          if (exp->out != (char *)0x0) {
            exp->out[exp->pos] = in[sVar5];
          }
          sVar4 = exp->pos + 1;
          exp->pos = sVar4;
          if (exp->olen == sVar4) {
            len = sVar5 + 1;
            iVar3 = 1;
            goto LAB_0010cdc7;
          }
        }
        break;
      case '\x01':
        if (in[sVar5] != '{') {
          sVar4 = exp->pos;
          if (exp->olen - sVar4 < 3) {
            return -1;
          }
          if (exp->out == (char *)0x0) {
            exp->pos = sVar4 + 2;
          }
          else {
            exp->pos = sVar4 + 1;
            exp->out[sVar4] = '$';
            cVar1 = in[sVar5];
            sVar4 = exp->pos;
            exp->pos = sVar4 + 1;
            exp->out[sVar4] = cVar1;
          }
          if (in[sVar5] == '$') break;
          goto LAB_0010ccde;
        }
        exp->name_pos = '\0';
        exp->state = '\x02';
        exp->exp_ofs = 0;
        break;
      case '\x02':
        cVar1 = in[sVar5];
        if (cVar1 == '}') {
          exp->name[exp->name_pos] = '\0';
          exp->state = '\x03';
          goto switchD_0010cc70_caseD_3;
        }
        bVar2 = exp->name_pos;
        if (0x1e < (ulong)bVar2) {
          return -1;
        }
        exp->name_pos = bVar2 + 1;
        exp->name[bVar2] = cVar1;
        break;
      case '\x03':
switchD_0010cc70_caseD_3:
        *pused_in = sVar5;
        iVar3 = (*exp->cb)(exp->priv,exp->name,exp->out,&exp->pos,exp->olen,&exp->exp_ofs);
        *pused_out = exp->pos;
        if (iVar3 == -2) {
          return -2;
        }
        if (iVar3 == 1) {
          return 1;
        }
LAB_0010ccde:
        exp->state = '\0';
      }
      sVar5 = sVar5 + 1;
    } while (len != sVar5);
  }
  iVar3 = 0;
  if (exp->out != (char *)0x0) {
    exp->out[exp->pos] = '\0';
  }
LAB_0010cdc7:
  *pused_in = len;
  *pused_out = exp->pos;
  return iVar3;
}

Assistant:

int
lws_strexp_expand(lws_strexp_t *exp, const char *in, size_t len,
		  size_t *pused_in, size_t *pused_out)
{
	size_t used = 0;
	int n;

	while (used < len) {

		switch (exp->state) {
		case LWS_EXPS_LITERAL:
			if (*in == '$') {
				exp->state = LWS_EXPS_OPEN_OR_LIT;
				break;
			}

			if (exp->out)
				exp->out[exp->pos] = *in;
			exp->pos++;
			if (exp->olen - exp->pos < 1) {
				*pused_in = used + 1;
				*pused_out = exp->pos;
				return LSTRX_FILLED_OUT;
			}
			break;

		case LWS_EXPS_OPEN_OR_LIT:
			if (*in == '{') {
				exp->state = LWS_EXPS_NAME_OR_CLOSE;
				exp->name_pos = 0;
				exp->exp_ofs = 0;
				break;
			}
			/* treat as a literal */
			if (exp->olen - exp->pos < 3)
				return -1;

			if (exp->out) {
				exp->out[exp->pos++] = '$';
				exp->out[exp->pos++] = *in;
			} else
				exp->pos += 2;
			if (*in != '$')
				exp->state = LWS_EXPS_LITERAL;
			break;

		case LWS_EXPS_NAME_OR_CLOSE:
			if (*in == '}') {
				exp->name[exp->name_pos] = '\0';
				exp->state = LWS_EXPS_DRAIN;
				goto drain;
			}
			if (exp->name_pos >= sizeof(exp->name) - 1)
				return LSTRX_FATAL_NAME_TOO_LONG;

			exp->name[exp->name_pos++] = *in;
			break;

		case LWS_EXPS_DRAIN:
drain:
			*pused_in = used;
			n = exp->cb(exp->priv, exp->name, exp->out, &exp->pos,
				    exp->olen, &exp->exp_ofs);
			*pused_out = exp->pos;
			if (n == LSTRX_FILLED_OUT ||
			    n == LSTRX_FATAL_NAME_UNKNOWN)
				return n;

			exp->state = LWS_EXPS_LITERAL;
			break;
		}

		used++;
		in++;
	}

	if (exp->out)
		exp->out[exp->pos] = '\0';
	*pused_in = used;
	*pused_out = exp->pos;

	return LSTRX_DONE;
}